

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * __thiscall
httplib::detail::random_string_abi_cxx11_(string *__return_storage_ptr__,detail *this,size_t length)

{
  undefined8 uVar1;
  allocator local_1b;
  undefined1 local_1a;
  detail *pdStack_18;
  anon_class_1_0_00000001 randchar;
  size_t length_local;
  string *str;
  
  local_1a = 0;
  pdStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(ulong)this,'\0',&local_1b);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b);
  uVar1 = std::__cxx11::string::begin();
  std::
  generate_n<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,httplib::detail::random_string(unsigned_long)::_lambda()_1_>
            (uVar1,pdStack_18);
  return __return_storage_ptr__;
}

Assistant:

inline std::string random_string(size_t length) {
  auto randchar = []() -> char {
    const char charset[] = "0123456789"
                           "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                           "abcdefghijklmnopqrstuvwxyz";
    const size_t max_index = (sizeof(charset) - 1);
    return charset[static_cast<size_t>(rand()) % max_index];
  };
  std::string str(length, 0);
  std::generate_n(str.begin(), length, randchar);
  return str;
}